

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc-parse.c
# Opt level: O3

void yyStackOverflow(yyParser_conflict *yypParser)

{
  ZCCParseState *pZVar1;
  yyStackEntry_conflict *pyVar2;
  
  pZVar1 = yypParser->stat;
  pyVar2 = yypParser->yytos + -1;
  yypParser->yytos = pyVar2;
  if (yyTraceFILE != (FILE *)0x0) {
    fprintf((FILE *)yyTraceFILE,"%sStack Overflow!\n",yyTracePrompt);
    fflush((FILE *)yyTraceFILE);
    pyVar2 = yypParser->yytos;
  }
  while (yypParser->yystack < pyVar2) {
    yy_pop_parser_stack(yypParser);
    pyVar2 = yypParser->yytos;
  }
  yypParser->stat = pZVar1;
  return;
}

Assistant:

static void yyStackOverflow(yyParser *yypParser){
   ZCCParseARG_FETCH;
   yypParser->yytos--;
#ifndef NDEBUG
   if( yyTraceFILE ){
     fprintf(yyTraceFILE,"%sStack Overflow!\n",yyTracePrompt);
     fflush(yyTraceFILE);
   }
#endif
   while( yypParser->yytos>yypParser->yystack ) yy_pop_parser_stack(yypParser);
   /* Here code is inserted which will execute if the parser
   ** stack every overflows */
/******** Begin %stack_overflow code ******************************************/
/******** End %stack_overflow code ********************************************/
   ZCCParseARG_STORE; /* Suppress warning about unused %extra_argument var */
}